

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node-translator.c++
# Opt level: O2

uint __thiscall
capnp::compiler::NodeTranslator::StructLayout::Group::DataLocationUsage::allocateFromHole
          (DataLocationUsage *this,Group *group,DataLocation *location,uint lgSize)

{
  undefined8 in_RAX;
  uchar limitLgSize;
  uint uVar1;
  uchar local_32;
  byte local_31;
  
  _local_32 = (undefined2)((ulong)in_RAX >> 0x30);
  limitLgSize = (uchar)lgSize;
  if (this->isUsed == false) {
    this->isUsed = true;
    this->lgSizeUsed = limitLgSize;
    uVar1 = 0;
  }
  else if (lgSize < this->lgSizeUsed) {
    HoleSet<unsigned_char>::tryAllocate((HoleSet<unsigned_char> *)&local_32,(uchar)&this->holes);
    if (local_32 == '\x01') {
      uVar1 = (uint)local_31;
    }
    else {
      uVar1 = 1 << (this->lgSizeUsed - limitLgSize & 0x1f);
      HoleSet<unsigned_char>::addHolesAtEnd
                (&this->holes,limitLgSize,(char)uVar1 + '\x01',this->lgSizeUsed);
      this->lgSizeUsed = this->lgSizeUsed + '\x01';
    }
  }
  else {
    uVar1 = 1;
    HoleSet<unsigned_char>::addHolesAtEnd(&this->holes,this->lgSizeUsed,'\x01',limitLgSize);
    this->lgSizeUsed = limitLgSize + '\x01';
  }
  return (location->offset << ((char)location->lgSize - limitLgSize & 0x1f)) + uVar1;
}

Assistant:

uint allocateFromHole(Group& group, Union::DataLocation& location, uint lgSize) {
        // Allocate the given space from an existing hole, given smallestHoleAtLeast() already
        // returned non-null indicating such a hole exists.

        uint result;

        if (!isUsed) {
          // The location is totally unused, so just allocate from the beginning.
          KJ_DASSERT(lgSize <= location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          result = 0;
          isUsed = true;
          lgSizeUsed = lgSize;
        } else if (lgSize >= lgSizeUsed) {
          // Requested size is at least our current usage, so clearly won't fit in any holes.
          // We must expand to double the requested size, and return the second half.
          KJ_DASSERT(lgSize < location.lgSize, "Did smallestHoleAtLeast() really find a hole?");
          holes.addHolesAtEnd(lgSizeUsed, 1, lgSize);
          lgSizeUsed = lgSize + 1;
          result = 1;
        } else KJ_IF_MAYBE(hole, holes.tryAllocate(lgSize)) {
          // Found a hole.
          result = *hole;
        } else {
          // The requested size is smaller than what we're using so far, but didn't fit in a
          // hole.  We should double our "used" size, then allocate from the new space.
          KJ_DASSERT(lgSizeUsed < location.lgSize,
                     "Did smallestHoleAtLeast() really find a hole?");
          result = 1 << (lgSizeUsed - lgSize);
          holes.addHolesAtEnd(lgSize, result + 1, lgSizeUsed);
          lgSizeUsed += 1;
        }